

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

ParseInfoTree * __thiscall
google::protobuf::TextFormat::ParseInfoTree::CreateNested
          (ParseInfoTree *this,FieldDescriptor *field)

{
  iterator __position;
  _Rb_tree_header *p_Var1;
  vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>
  *this_00;
  _Head_base<0UL,_google::protobuf::TextFormat::ParseInfoTree_*,_false> local_18;
  FieldDescriptor *local_10;
  
  local_10 = field;
  this_00 = (vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>
             *)std::
               map<const_google::protobuf::FieldDescriptor_*,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>,_std::less<const_google::protobuf::FieldDescriptor_*>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>,_std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>_>_>_>_>_>
               ::operator[](&this->nested_,&local_10);
  local_18._M_head_impl = (ParseInfoTree *)operator_new(0x60);
  p_Var1 = (_Rb_tree_header *)((long)&((local_18._M_head_impl)->locations_)._M_t + 8);
  *(_Base_ptr *)((long)&((local_18._M_head_impl)->locations_)._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&((local_18._M_head_impl)->locations_)._M_t + 0x18) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&((local_18._M_head_impl)->locations_)._M_t + 0x20) = (_Base_ptr)0x0;
  *(size_t *)((long)&((local_18._M_head_impl)->locations_)._M_t + 0x28) = 0;
  *(undefined8 *)&((local_18._M_head_impl)->nested_)._M_t._M_impl = 0;
  *(undefined8 *)
   &((_Rb_tree_header *)((long)&((local_18._M_head_impl)->nested_)._M_t + 8))->_M_header = 0;
  *(_Base_ptr *)((long)&((local_18._M_head_impl)->nested_)._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&((local_18._M_head_impl)->nested_)._M_t + 0x18) = (_Base_ptr)0x0;
  *(_Base_ptr *)((long)&((local_18._M_head_impl)->nested_)._M_t + 0x20) = (_Base_ptr)0x0;
  *(size_t *)((long)&((local_18._M_head_impl)->nested_)._M_t + 0x28) = 0;
  *(undefined8 *)&((local_18._M_head_impl)->locations_)._M_t = 0;
  *(undefined8 *)
   &((_Rb_tree_header *)((long)&((local_18._M_head_impl)->locations_)._M_t + 8))->_M_header = 0;
  *(_Rb_tree_header **)((long)&((local_18._M_head_impl)->locations_)._M_t + 0x18) = p_Var1;
  *(_Rb_tree_header **)((long)&((local_18._M_head_impl)->locations_)._M_t + 0x20) = p_Var1;
  *(size_t *)((long)&((local_18._M_head_impl)->locations_)._M_t + 0x28) = 0;
  p_Var1 = (_Rb_tree_header *)((long)&((local_18._M_head_impl)->nested_)._M_t + 8);
  (((_Rb_tree_header *)((long)&((local_18._M_head_impl)->nested_)._M_t + 8))->_M_header)._M_color =
       _S_red;
  *(_Base_ptr *)((long)&((local_18._M_head_impl)->nested_)._M_t + 0x10) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)((long)&((local_18._M_head_impl)->nested_)._M_t + 0x18) = p_Var1;
  *(_Rb_tree_header **)((long)&((local_18._M_head_impl)->nested_)._M_t + 0x20) = p_Var1;
  *(size_t *)((long)&((local_18._M_head_impl)->nested_)._M_t + 0x28) = 0;
  __position._M_current =
       *(unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>
         **)(this_00 + 8);
  if (__position._M_current ==
      *(unique_ptr<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>
        **)(this_00 + 0x10)) {
    std::
    vector<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>,std::allocator<std::unique_ptr<google::protobuf::TextFormat::ParseInfoTree,std::default_delete<google::protobuf::TextFormat::ParseInfoTree>>>>
    ::_M_realloc_insert<google::protobuf::TextFormat::ParseInfoTree*>
              (this_00,__position,&local_18._M_head_impl);
  }
  else {
    ((__position._M_current)->_M_t).
    super___uniq_ptr_impl<google::protobuf::TextFormat::ParseInfoTree,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::TextFormat::ParseInfoTree_*,_std::default_delete<google::protobuf::TextFormat::ParseInfoTree>_>
    .super__Head_base<0UL,_google::protobuf::TextFormat::ParseInfoTree_*,_false>._M_head_impl =
         local_18._M_head_impl;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  return *(ParseInfoTree **)(*(long *)(this_00 + 8) + -8);
}

Assistant:

TextFormat::ParseInfoTree* TextFormat::ParseInfoTree::CreateNested(
    const FieldDescriptor* field) {
  // Owned by us in the map.
  auto& vec = nested_[field];
  vec.emplace_back(new TextFormat::ParseInfoTree());
  return vec.back().get();
}